

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O1

void sptk::world::inv(double **r,int n,double **invr)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  int j;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int k_1;
  ulong uVar13;
  ulong uVar14;
  
  uVar13 = (ulong)(uint)n;
  if (0 < n) {
    uVar12 = 0;
    do {
      memset(invr[uVar12],0,uVar13 * 8);
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  if (0 < n) {
    uVar12 = 0;
    do {
      invr[uVar12][uVar12] = 1.0;
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  if (0 < n) {
    uVar10 = 1;
    lVar11 = 0;
    uVar12 = uVar13;
    uVar14 = 0;
    do {
      pdVar2 = r[uVar14];
      dVar1 = pdVar2[uVar14];
      pdVar2[uVar14] = 1.0;
      pdVar3 = invr[uVar14];
      uVar7 = 0;
      do {
        pdVar3[uVar7] = pdVar3[uVar7] / dVar1;
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
      uVar7 = uVar14 + 1;
      if (uVar7 < uVar13) {
        uVar8 = 1;
        do {
          *(double *)((long)pdVar2 + uVar8 * 8 + lVar11) =
               *(double *)((long)pdVar2 + uVar8 * 8 + lVar11) / dVar1;
          uVar8 = uVar8 + 1;
        } while (uVar12 != uVar8);
      }
      if (uVar7 < uVar13) {
        pdVar3 = invr[uVar14];
        uVar8 = uVar10;
        do {
          pdVar4 = r[uVar8];
          dVar1 = pdVar4[uVar14];
          pdVar5 = invr[uVar8];
          uVar9 = 0;
          do {
            pdVar5[uVar9] = pdVar5[uVar9] - pdVar3[uVar9] * dVar1;
            uVar9 = uVar9 + 1;
          } while (uVar10 != uVar9);
          uVar9 = 0;
          do {
            *(double *)((long)pdVar4 + uVar9 * 8 + lVar11) =
                 *(double *)((long)pdVar4 + uVar9 * 8 + lVar11) -
                 *(double *)((long)pdVar2 + uVar9 * 8 + lVar11) * dVar1;
            uVar9 = uVar9 + 1;
          } while (uVar12 != uVar9);
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar13);
      }
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 8;
      uVar12 = uVar12 - 1;
      uVar14 = uVar7;
    } while (uVar7 != uVar13);
  }
  if (0 < n) {
    uVar14 = (ulong)(n - 1);
    uVar12 = uVar13;
    do {
      uVar10 = uVar12 - 1;
      if (1 < (long)uVar12) {
        pdVar2 = invr[uVar10];
        uVar7 = 0;
        do {
          dVar1 = r[uVar7][uVar10];
          pdVar3 = invr[uVar7];
          uVar8 = 0;
          do {
            pdVar3[uVar8] = pdVar3[uVar8] - pdVar2[uVar8] * dVar1;
            uVar8 = uVar8 + 1;
          } while (uVar13 != uVar8);
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar14);
      }
      uVar14 = uVar14 - 1;
      bVar6 = 1 < (long)uVar12;
      uVar12 = uVar10;
    } while (bVar6);
  }
  return;
}

Assistant:

void inv(double **r, int n, double **invr) {
  for (int i = 0; i < n; ++i)
    for (int j = 0; j < n; ++j) invr[i][j] = 0.0;
  for (int i = 0; i < n; ++i) invr[i][i] = 1.0;

  double tmp;
  for (int i = 0; i < n; ++i) {
    tmp = r[i][i];
    r[i][i] = 1.0;
    for (int j = 0; j <= i; ++j) invr[i][j] /= tmp;
    for (int j = i + 1; j < n; ++j) r[i][j] /= tmp;
    for (int j = i + 1; j < n; ++j) {
      tmp = r[j][i];
      for (int k = 0; k <= i; ++k) invr[j][k] -= invr[i][k] * tmp;
      for (int k = i; k < n; ++k) r[j][k] -= r[i][k] * tmp;
    }
  }

  for (int i = n - 1; i >= 0; --i) {
    for (int j = 0; j < i; ++j) {
      tmp = r[j][i];
      for (int k = 0; k < n; ++k) invr[j][k] -= invr[i][k] * tmp;
    }
  }
}